

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

char * cmSHA512_End(SHA_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  byte local_48 [64];
  
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      buffer = (char *)0x0;
      memset(context,0,0xd0);
    }
    else {
      cmSHA512_Final(local_48,context);
      for (lVar2 = 0; (int)lVar2 != 0x40; lVar2 = lVar2 + 1) {
        bVar1 = local_48[lVar2];
        *buffer = "0123456789abcdef"[bVar1 >> 4];
        buffer[1] = "0123456789abcdef"[bVar1 & 0xf];
        buffer = buffer + 2;
      }
      *buffer = '\0';
    }
    return buffer;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x5ef,"char *cmSHA512_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA512_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA512_Final(digest, context);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}